

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O0

void nn_cipc_destroy(nn_epbase *self)

{
  nn_fsm *local_20;
  nn_cipc *cipc;
  nn_epbase *self_local;
  
  if (self == (nn_epbase *)0x0) {
    local_20 = (nn_fsm *)0x0;
  }
  else {
    local_20 = (nn_fsm *)(self + -6);
  }
  nn_sipc_term((nn_sipc *)&local_20[0xb].state);
  nn_backoff_term((nn_backoff *)&local_20[8].owner);
  nn_usock_term((nn_usock *)&local_20[1].srcptr);
  nn_fsm_term(local_20);
  nn_epbase_term((nn_epbase *)&local_20[1].shutdown_fn);
  nn_free(local_20);
  return;
}

Assistant:

static void nn_cipc_destroy (struct nn_epbase *self)
{
    struct nn_cipc *cipc;

    cipc = nn_cont (self, struct nn_cipc, epbase);

    nn_sipc_term (&cipc->sipc);
    nn_backoff_term (&cipc->retry);
    nn_usock_term (&cipc->usock);
    nn_fsm_term (&cipc->fsm);
    nn_epbase_term (&cipc->epbase);

    nn_free (cipc);
}